

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O1

int stlfts_(double *x,int *n,int *np,double *trend,double *work)

{
  int local_38 [2];
  int i__1;
  int c__3;
  
  local_38[1] = 3;
  stlma_(x,n,np,trend);
  local_38[0] = (*n - *np) + 1;
  stlma_(trend,local_38,np,work);
  local_38[0] = *n + *np * -2 + 2;
  stlma_(work,local_38,local_38 + 1,trend);
  return 0;
}

Assistant:

int stlfts_(double *x, int *n, int *np, double *trend, double *work)
{
    /* System generated locals */
    int i__1;
	int c__3 = 3;

    /* Parameter adjustments */
    --work;
    --trend;
    --x;

    /* Function Body */
    stlma_(&x[1], n, np, &trend[1]);
    i__1 = *n - *np + 1;
    stlma_(&trend[1], &i__1, np, &work[1]);
    i__1 = *n - (*np << 1) + 2;
    stlma_(&work[1], &i__1, &c__3, &trend[1]);
    return 0;
}